

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O1

connection_context_t * create_connection_context(uv_os_sock_t sock,int is_server_connection)

{
  long *plVar1;
  __pthread_list_t *handle;
  uv_loop_t *handle_00;
  long lVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  connection_context_t *pcVar6;
  ssize_t sVar7;
  ulong uVar8;
  undefined4 extraout_var;
  connection_context_t *extraout_RAX;
  connection_context_t *extraout_RAX_00;
  int *piVar9;
  undefined4 extraout_var_00;
  connection_context_t *extraout_RAX_01;
  connection_context_t *extraout_RAX_02;
  connection_context_t *extraout_RAX_03;
  uint extraout_EDX;
  size_t sVar10;
  uint uVar11;
  connection_context_t *pcVar12;
  uv_timer_t *handle_01;
  uv_loop_t *puVar13;
  uv_loop_t *puVar14;
  uv_loop_t *puVar15;
  undefined8 *__ptr;
  
  puVar13 = (uv_loop_t *)0x170;
  iVar4 = is_server_connection;
  pcVar6 = (connection_context_t *)malloc(0x170);
  if (pcVar6 == (connection_context_t *)0x0) {
    create_connection_context_cold_3();
LAB_00165328:
    create_connection_context_cold_1();
  }
  else {
    pcVar6->sock = sock;
    pcVar6->is_server_connection = is_server_connection;
    pcVar6->read = 0;
    pcVar6->sent = 0;
    pcVar6->open_handles = 0;
    pcVar6->got_fin = 0;
    pcVar6->sent_fin = 0;
    pcVar6->got_disconnect = 0;
    pcVar6->events = 0;
    pcVar6->delayed_events = 0;
    puVar13 = uv_default_loop();
    pcVar12 = pcVar6;
    iVar3 = uv_poll_init_socket(puVar13,(uv_poll_t *)pcVar6,sock);
    iVar4 = (int)pcVar12;
    pcVar6->open_handles = pcVar6->open_handles + 1;
    (pcVar6->poll_handle).data = pcVar6;
    if (iVar3 != 0) goto LAB_00165328;
    puVar13 = uv_default_loop();
    handle_01 = &pcVar6->timer_handle;
    iVar3 = uv_timer_init(puVar13,handle_01);
    iVar4 = (int)handle_01;
    pcVar6->open_handles = pcVar6->open_handles + 1;
    (pcVar6->timer_handle).data = pcVar6;
    if (iVar3 == 0) {
      return pcVar6;
    }
  }
  create_connection_context_cold_2();
  puVar14 = puVar13;
  if (iVar4 == 0) {
    handle_00 = (uv_loop_t *)puVar13->data;
    uVar11 = *(uint *)((long)&handle_00->cloexec_lock + 0x34);
    if ((uVar11 & extraout_EDX) == 0) goto LAB_00165840;
    if ((~uVar11 & extraout_EDX) != 0) goto LAB_00165845;
    if ((extraout_EDX & 1) == 0) goto switchD_001653b5_caseD_4;
    iVar4 = rand();
    switch(iVar4 % 7) {
    case 0:
    case 1:
      uVar5 = (handle_00->cloexec_lock).__data.__wrphase_futex;
      puVar14 = (uv_loop_t *)(ulong)uVar5;
      sVar7 = recv(uVar5,connection_poll_cb::buffer,0x4a,0);
      uVar5 = (uint)sVar7;
      if (-1 < (int)uVar5) {
        if (uVar5 == 0) goto LAB_0016545a;
        plVar1 = (long *)((long)&handle_00->cloexec_lock + 0x10);
        *plVar1 = *plVar1 + (ulong)(uVar5 & 0x7fffffff);
        break;
      }
      goto LAB_00165854;
    case 2:
    case 3:
      uVar5 = (handle_00->cloexec_lock).__data.__wrphase_futex;
      puVar14 = (uv_loop_t *)(ulong)uVar5;
      uVar8 = recv(uVar5,connection_poll_cb::buffer_1,0x3a3,0);
      if (-1 < (int)uVar8) {
        if ((int)uVar8 != 0) {
          do {
            plVar1 = (long *)((long)&handle_00->cloexec_lock + 0x10);
            *plVar1 = *plVar1 + (uVar8 & 0xffffffff);
            uVar5 = (handle_00->cloexec_lock).__data.__wrphase_futex;
            puVar14 = (uv_loop_t *)(ulong)uVar5;
            uVar8 = recv(uVar5,connection_poll_cb::buffer_1,0x3a3,0);
          } while (0 < (int)uVar8);
          if ((int)uVar8 != 0) {
            piVar9 = __errno_location();
            if ((*piVar9 == 0xb) || (*piVar9 == 0x73)) break;
            connection_poll_cb_cold_4();
          }
        }
LAB_0016545a:
        *(undefined4 *)((long)&handle_00->cloexec_lock + 0x28) = 1;
        uVar11 = uVar11 & 0xfffffffe;
        break;
      }
      goto LAB_00165859;
    case 4:
      break;
    case 5:
      uVar11 = uVar11 & 0xfffffffe;
      puVar14 = (uv_loop_t *)&(handle_00->wq_mutex).__data.__list;
      puVar15 = puVar14;
      iVar4 = uv_is_active((uv_handle_t *)puVar14);
      if (iVar4 == 0) {
        *(undefined4 *)&handle_00->closing_handles = 1;
        uv_timer_start((uv_timer_t *)puVar14,delay_timer_cb,10,0);
      }
      else {
        *(byte *)&handle_00->closing_handles = *(byte *)&handle_00->closing_handles | 1;
        puVar14 = puVar15;
      }
      break;
    case 6:
      uv_poll_start((uv_poll_t *)handle_00,2,connection_poll_cb);
      puVar14 = handle_00;
      uv_poll_start((uv_poll_t *)handle_00,1,connection_poll_cb);
      *(undefined4 *)((long)&handle_00->cloexec_lock + 0x34) = 1;
      break;
    default:
      goto switchD_001653b5_default;
    }
switchD_001653b5_caseD_4:
    if ((extraout_EDX & 2) == 0) goto switchD_0016563c_caseD_4;
    if ((*(ulong *)((long)&handle_00->cloexec_lock + 0x18) < 0x10000) &&
       ((test_mode != '\x01' || (*(int *)((long)&handle_00->cloexec_lock + 0x20) == 0)))) {
      iVar4 = rand();
      switch(iVar4 % 7) {
      case 0:
      case 1:
        lVar2 = *(long *)((long)&handle_00->cloexec_lock + 0x18);
        if (lVar2 == 0x10000) goto LAB_00165863;
        uVar8 = 0x10000 - lVar2;
        sVar10 = 0x67;
        if (uVar8 < 0x67) {
          sVar10 = uVar8;
        }
        uVar5 = (handle_00->cloexec_lock).__data.__wrphase_futex;
        puVar14 = (uv_loop_t *)(ulong)uVar5;
        sVar7 = send(uVar5,connection_poll_cb::buffer_2,sVar10,0);
        uVar5 = (uint)sVar7;
        if ((int)uVar5 < 0) {
          piVar9 = __errno_location();
          if ((*piVar9 != 0xb) && (*piVar9 != 0x73)) {
            connection_poll_cb_cold_13();
            goto LAB_001657d7;
          }
LAB_001657ec:
          spurious_writable_wakeups = spurious_writable_wakeups + 1;
          break;
        }
        if (uVar5 != 0) {
          plVar1 = (long *)((long)&handle_00->cloexec_lock + 0x18);
          *plVar1 = *plVar1 + (ulong)(uVar5 & 0x7fffffff);
          valid_writable_wakeups = valid_writable_wakeups + 1;
          break;
        }
        goto LAB_0016586d;
      case 2:
      case 3:
        lVar2 = *(long *)((long)&handle_00->cloexec_lock + 0x18);
        if (lVar2 == 0x10000) goto LAB_00165868;
        sVar10 = 0x10000 - lVar2;
        if (0x4d1 < sVar10) {
          sVar10 = 0x4d2;
        }
        uVar5 = (handle_00->cloexec_lock).__data.__wrphase_futex;
        puVar14 = (uv_loop_t *)(ulong)uVar5;
        sVar7 = send(uVar5,connection_poll_cb::buffer_3,sVar10,0);
        uVar5 = (uint)sVar7;
        if (-1 < (int)uVar5) {
          if (uVar5 != 0) {
            valid_writable_wakeups = valid_writable_wakeups + 1;
            uVar8 = *(long *)((long)&handle_00->cloexec_lock + 0x18) + (ulong)(uVar5 & 0x7fffffff);
            *(ulong *)((long)&handle_00->cloexec_lock + 0x18) = uVar8;
            while (uVar8 < 0x10000) {
              sVar10 = 0x10000 - uVar8;
              if (uVar8 < 0xfb2f) {
                sVar10 = 0x4d2;
              }
              uVar5 = (handle_00->cloexec_lock).__data.__wrphase_futex;
              puVar14 = (uv_loop_t *)(ulong)uVar5;
              sVar7 = send(uVar5,connection_poll_cb::buffer_3,sVar10,0);
              if ((int)(uint)sVar7 < 1) {
                piVar9 = __errno_location();
                if ((*piVar9 != 0xb) && (*piVar9 != 0x73)) {
                  connection_poll_cb_cold_8();
                  goto LAB_0016583b;
                }
                break;
              }
              uVar8 = *(long *)((long)&handle_00->cloexec_lock + 0x18) +
                      (ulong)((uint)sVar7 & 0x7fffffff);
              *(ulong *)((long)&handle_00->cloexec_lock + 0x18) = uVar8;
            }
            break;
          }
          goto LAB_00165872;
        }
LAB_001657d7:
        piVar9 = __errno_location();
        if ((*piVar9 == 0xb) || (*piVar9 == 0x73)) goto LAB_001657ec;
        goto LAB_0016587c;
      case 4:
        break;
      case 5:
        uVar11 = uVar11 & 0xfffffffd;
        handle = &(handle_00->wq_mutex).__data.__list;
        iVar4 = uv_is_active((uv_handle_t *)handle);
        if (iVar4 == 0) {
          *(undefined4 *)&handle_00->closing_handles = 2;
          uv_timer_start((uv_timer_t *)handle,delay_timer_cb,100,0);
        }
        else {
          *(byte *)&handle_00->closing_handles = *(byte *)&handle_00->closing_handles | 2;
        }
        break;
      case 6:
        uv_poll_start((uv_poll_t *)handle_00,1,connection_poll_cb);
        uv_poll_start((uv_poll_t *)handle_00,2,connection_poll_cb);
        *(undefined4 *)((long)&handle_00->cloexec_lock + 0x34) = 2;
        break;
      default:
        goto switchD_0016563c_default;
      }
switchD_0016563c_caseD_4:
      if ((extraout_EDX & 4) != 0) {
        (handle_00->cloexec_lock).__data.__flags = 1;
        disconnects = disconnects + 1;
        uVar11 = uVar11 & 0xfffffffb;
      }
      if (((*(int *)((long)&handle_00->cloexec_lock + 0x28) == 0) ||
          (*(int *)((long)&handle_00->cloexec_lock + 0x2c) == 0)) ||
         ((handle_00->cloexec_lock).__data.__flags == 0)) {
        if (uVar11 != *(uint *)((long)&handle_00->cloexec_lock + 0x34)) {
          *(uint *)((long)&handle_00->cloexec_lock + 0x34) = uVar11;
          uv_poll_start((uv_poll_t *)puVar13,uVar11,connection_poll_cb);
        }
      }
      else {
        close_socket((handle_00->cloexec_lock).__data.__wrphase_futex);
        uv_close((uv_handle_t *)handle_00,connection_close_cb);
        uv_close((uv_handle_t *)&(handle_00->wq_mutex).__data.__list,connection_close_cb);
        *(undefined4 *)((long)&handle_00->cloexec_lock + 0x34) = 0;
      }
      iVar4 = *(int *)((long)&handle_00->cloexec_lock + 0x34);
      iVar3 = uv_is_active((uv_handle_t *)puVar13);
      pcVar6 = (connection_context_t *)CONCAT44(extraout_var,iVar3);
      if (iVar4 != 0) {
        if (iVar3 == 1) {
          return pcVar6;
        }
        connection_poll_cb_cold_16();
        pcVar6 = extraout_RAX;
      }
      if ((int)pcVar6 == 0) {
        return pcVar6;
      }
      goto LAB_0016584a;
    }
    uVar5 = (handle_00->cloexec_lock).__data.__wrphase_futex;
    puVar14 = (uv_loop_t *)(ulong)uVar5;
    iVar4 = shutdown(uVar5,1);
    if (iVar4 == 0) {
      *(undefined4 *)((long)&handle_00->cloexec_lock + 0x2c) = 1;
      uVar11 = uVar11 & 0xfffffffd;
      goto switchD_0016563c_caseD_4;
    }
  }
  else {
LAB_0016583b:
    connection_poll_cb_cold_1();
    puVar13 = puVar14;
LAB_00165840:
    connection_poll_cb_cold_18();
LAB_00165845:
    connection_poll_cb_cold_2();
LAB_0016584a:
    connection_poll_cb_cold_17();
    puVar14 = puVar13;
  }
  connection_poll_cb_cold_7();
LAB_00165854:
  connection_poll_cb_cold_5();
LAB_00165859:
  connection_poll_cb_cold_3();
switchD_001653b5_default:
  connection_poll_cb_cold_6();
LAB_00165863:
  connection_poll_cb_cold_14();
LAB_00165868:
  connection_poll_cb_cold_11();
LAB_0016586d:
  connection_poll_cb_cold_12();
LAB_00165872:
  connection_poll_cb_cold_9();
switchD_0016563c_default:
  connection_poll_cb_cold_15();
LAB_0016587c:
  connection_poll_cb_cold_10();
  iVar4 = close((int)puVar14);
  if ((iVar4 == 0) || (piVar9 = __errno_location(), *piVar9 == 0x68)) {
    return extraout_RAX_00;
  }
  close_socket_cold_1();
  puVar13 = (uv_loop_t *)puVar14->data;
  iVar4 = uv_is_active((uv_handle_t *)puVar14);
  if (iVar4 == 0) {
    if (*(uint *)&puVar13->closing_handles == 0) goto LAB_001658e3;
    uVar11 = *(uint *)&puVar13->closing_handles | *(uint *)((long)&puVar13->cloexec_lock + 0x34);
    *(uint *)((long)&puVar13->cloexec_lock + 0x34) = uVar11;
    *(undefined4 *)&puVar13->closing_handles = 0;
    iVar4 = uv_poll_start((uv_poll_t *)puVar13,uVar11,connection_poll_cb);
    if (iVar4 == 0) {
      return (connection_context_t *)CONCAT44(extraout_var_00,iVar4);
    }
  }
  else {
    delay_timer_cb_cold_1();
LAB_001658e3:
    puVar13 = puVar14;
    delay_timer_cb_cold_3();
  }
  delay_timer_cb_cold_2();
  __ptr = (undefined8 *)puVar13->data;
  piVar9 = (int *)((long)__ptr + 0x154);
  *piVar9 = *piVar9 + -1;
  if (*piVar9 != 0) {
    return extraout_RAX_01;
  }
  if ((test_mode == '\x01') && (*(int *)(__ptr + 0x2a) == 0)) {
    if (__ptr[0x28] != 0) {
      connection_close_cb_cold_2();
LAB_0016595f:
      connection_close_cb_cold_1();
      goto LAB_00165964;
    }
  }
  else if (__ptr[0x28] != 0x10000) goto LAB_0016595f;
  if ((test_mode != '\0') && (*(int *)(__ptr + 0x2a) != 0)) {
    if (__ptr[0x29] == 0) goto LAB_00165944;
    connection_close_cb_cold_3();
  }
  if (__ptr[0x29] != 0x10000) {
LAB_00165964:
    connection_close_cb_cold_4();
    free((void *)*__ptr);
    return extraout_RAX_03;
  }
LAB_00165944:
  closed_connections = closed_connections + 1;
  free(__ptr);
  return extraout_RAX_02;
}

Assistant:

static connection_context_t* create_connection_context(
    uv_os_sock_t sock, int is_server_connection) {
  int r;
  connection_context_t* context;

  context = (connection_context_t*) malloc(sizeof *context);
  ASSERT(context != NULL);

  context->sock = sock;
  context->is_server_connection = is_server_connection;
  context->read = 0;
  context->sent = 0;
  context->open_handles = 0;
  context->events = 0;
  context->delayed_events = 0;
  context->got_fin = 0;
  context->sent_fin = 0;
  context->got_disconnect = 0;

  r = uv_poll_init_socket(uv_default_loop(), &context->poll_handle, sock);
  context->open_handles++;
  context->poll_handle.data = context;
  ASSERT(r == 0);

  r = uv_timer_init(uv_default_loop(), &context->timer_handle);
  context->open_handles++;
  context->timer_handle.data = context;
  ASSERT(r == 0);

  return context;
}